

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::InsertEndChild(TiXmlNode *this,TiXmlNode *addThis)

{
  TiXmlNode **ppTVar1;
  int iVar2;
  undefined4 extraout_var;
  TiXmlNode *pTVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TiXmlNode *node_1;
  TiXmlNode *node;
  
  pTVar3 = this;
  if (addThis->type == DOCUMENT) {
    do {
      iVar2 = (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar3);
      if (CONCAT44(extraout_var_00,iVar2) != 0) {
        iVar2 = (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar3);
        if (CONCAT44(extraout_var_01,iVar2) == 0) {
          return (TiXmlNode *)0x0;
        }
        while (iVar2 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[4])(this),
              CONCAT44(extraout_var_02,iVar2) == 0) {
          this = this->parent;
        }
        iVar2 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[4])(this);
        TiXmlDocument::SetError
                  ((TiXmlDocument *)CONCAT44(extraout_var_03,iVar2),0x10,(char *)0x0,
                   (TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
        return (TiXmlNode *)0x0;
      }
      ppTVar1 = &pTVar3->parent;
      pTVar3 = *ppTVar1;
    } while (*ppTVar1 != (TiXmlNode *)0x0);
  }
  else {
    iVar2 = (*(addThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])(addThis);
    if ((TiXmlNode *)CONCAT44(extraout_var,iVar2) != (TiXmlNode *)0x0) {
      pTVar3 = LinkEndChild(this,(TiXmlNode *)CONCAT44(extraout_var,iVar2));
      return pTVar3;
    }
  }
  return (TiXmlNode *)0x0;
}

Assistant:

TiXmlNode* TiXmlNode::InsertEndChild(const TiXmlNode& addThis) {
	if (addThis.Type() == TiXmlNode::DOCUMENT) {
		if (GetDocument())
			GetDocument()->SetError(TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0,
				TIXML_ENCODING_UNKNOWN);
		return 0;
	}
	TiXmlNode* node = addThis.Clone();
	if (!node)
		return 0;

	return LinkEndChild(node);
}